

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall wasm::Pass::~Pass(Pass *this)

{
  ~Pass(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Pass() = default;